

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_set_str_value_test(void)

{
  btree_kv_ops *__ptr;
  btree_kv_ops *kv_ops;
  btree *tree;
  uint64_t v_src;
  uint64_t v_dst;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint8_t local_a7;
  btree_kv_ops *in_stack_ffffffffffffff60;
  long local_60;
  long local_58 [5];
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 100;
  local_a7 = '\b';
  __ptr = btree_str_kv_get_kb64_vb64(in_stack_ffffffffffffff60);
  (*__ptr->set_value)((btree *)&stack0xffffffffffffff58,&local_60,local_58);
  if (local_60 != local_58[0]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x2da);
    kv_set_str_value_test::__test_pass = 0;
    if (local_60 != local_58[0]) {
      __assert_fail("v_src == v_dst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x2da,"void kv_set_str_value_test()");
    }
  }
  local_58[0] = 200;
  (*__ptr->set_value)((btree *)&stack0xffffffffffffff58,local_58,&local_60);
  if (local_60 != local_58[0]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x2df);
    kv_set_str_value_test::__test_pass = 0;
    if (local_60 != local_58[0]) {
      __assert_fail("v_src == v_dst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x2df,"void kv_set_str_value_test()");
    }
  }
  free(__ptr);
  memleak_end();
  if (kv_set_str_value_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_set_str_value_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_set_str_value_test");
  }
  return;
}

Assistant:

void kv_set_str_value_test()
{
    TEST_INIT();
    memleak_start();

    uint64_t v_dst, v_src = 100;
    btree *tree = alca(struct btree, 1);
    tree->vsize = sizeof(v_dst);
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);

    // set dst value
    kv_ops->set_value(tree,(void *)&v_src,(void *)&v_dst);

    // verify
    TEST_CHK(v_src == v_dst);

    // update dest and copy back to source
    v_dst = 200;
    kv_ops->set_value(tree,(void *)&v_dst,(void *)&v_src);
    TEST_CHK(v_src == v_dst);

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv_set_str_value_test");
}